

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O2

void sptk::world::makewt(int nw,int *ip,double *w)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  double *pdVar4;
  undefined1 (*pauVar5) [16];
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  
  *ip = nw;
  ip[1] = 1;
  if (nw < 3) {
    return;
  }
  uVar8 = (uint)nw >> 1;
  dVar14 = 0.7853981633974483 / (double)uVar8;
  dVar11 = cos((double)uVar8 * dVar14);
  *w = 1.0;
  w[1] = dVar11;
  if (uVar8 == 4) {
    dVar12 = cos(dVar14 + dVar14);
    w[2] = dVar12;
    dVar14 = sin(dVar14 + dVar14);
    uVar3 = 0;
    pdVar4 = w;
    do {
      pdVar4[3] = dVar14;
LAB_0010e1f9:
      auVar1 = _DAT_00115ed0;
      uVar6 = uVar3;
      uVar9 = uVar8;
      while( true ) {
        uVar7 = uVar6;
        if (uVar9 < 3) {
          return;
        }
        uVar2 = uVar9 + (int)uVar7;
        uVar3 = (ulong)uVar2;
        uVar8 = uVar9 >> 1;
        w[uVar3] = 1.0;
        w[uVar3 + 1] = dVar11;
        if (uVar8 == 4) break;
        bVar10 = 9 < uVar9;
        uVar6 = (ulong)uVar2;
        uVar9 = uVar8;
        if (bVar10) {
          auVar15._8_8_ = w[uVar7 + 6];
          auVar15._0_8_ = w[uVar7 + 4];
          auVar15 = divpd(auVar1,auVar15);
          *(undefined1 (*) [16])(w + uVar3 + 2) = auVar15;
          pauVar5 = (undefined1 (*) [16])(w + uVar7 + 10);
          for (uVar6 = 4; uVar6 < uVar8; uVar6 = uVar6 + 4) {
            dVar14 = *(double *)(pauVar5[-1] + 8);
            auVar15 = *pauVar5;
            w[uVar3 + uVar6] = *(double *)pauVar5[-1];
            (w + uVar3 + uVar6)[1] = dVar14;
            *(undefined1 (*) [16])(w + uVar3 + uVar6 + 2) = auVar15;
            pauVar5 = pauVar5 + 4;
          }
          uVar6 = (ulong)uVar2;
        }
      }
      pdVar4 = w + uVar3;
      dVar14 = w[uVar7 + 5];
      pdVar4[2] = w[uVar7 + 4];
    } while( true );
  }
  uVar3 = 0;
  if ((uint)nw < 10) goto LAB_0010e1f9;
  uVar6 = 4;
  makeipt(nw,ip);
  dVar12 = cos(dVar14 + dVar14);
  w[2] = 0.5 / dVar12;
  dVar12 = cos(dVar14 * 6.0);
  w[3] = 0.5 / dVar12;
  do {
    uVar3 = 0;
    if (uVar8 <= uVar6) goto LAB_0010e1f9;
    dVar12 = dVar14 * (double)(int)uVar6;
    dVar13 = cos(dVar12);
    w[uVar6] = dVar13;
    dVar12 = sin(dVar12);
    w[uVar6 + 1] = dVar12;
    dVar12 = (double)(int)uVar6 * dVar14 * 3.0;
    dVar13 = cos(dVar12);
    w[uVar6 + 2] = dVar13;
    dVar12 = sin(dVar12);
    w[uVar6 + 3] = -dVar12;
    uVar6 = uVar6 + 4;
  } while( true );
}

Assistant:

void makewt(int nw, int *ip, double *w) {
#if 0
  void makeipt(int nw, int *ip);
#endif
  int j, nwh, nw0, nw1;
  double delta, wn4r, wk1r, wk1i, wk3r, wk3i;

  ip[0] = nw;
  ip[1] = 1;
  if (nw > 2) {
    nwh = nw >> 1;
    delta = atan(1.0) / nwh;
    wn4r = cos(delta * nwh);
    w[0] = 1;
    w[1] = wn4r;
    if (nwh == 4) {
      w[2] = cos(delta * 2);
      w[3] = sin(delta * 2);
    } else if (nwh > 4) {
      makeipt(nw, ip);
      w[2] = 0.5 / cos(delta * 2);
      w[3] = 0.5 / cos(delta * 6);
      for (j = 4; j < nwh; j += 4) {
        w[j] = cos(delta * j);
        w[j + 1] = sin(delta * j);
        w[j + 2] = cos(3 * delta * j);
        w[j + 3] = -sin(3 * delta * j);
      }
    }
    nw0 = 0;
    while (nwh > 2) {
      nw1 = nw0 + nwh;
      nwh >>= 1;
      w[nw1] = 1;
      w[nw1 + 1] = wn4r;
      if (nwh == 4) {
        wk1r = w[nw0 + 4];
        wk1i = w[nw0 + 5];
        w[nw1 + 2] = wk1r;
        w[nw1 + 3] = wk1i;
      } else if (nwh > 4) {
        wk1r = w[nw0 + 4];
        wk3r = w[nw0 + 6];
        w[nw1 + 2] = 0.5 / wk1r;
        w[nw1 + 3] = 0.5 / wk3r;
        for (j = 4; j < nwh; j += 4) {
          wk1r = w[nw0 + 2 * j];
          wk1i = w[nw0 + 2 * j + 1];
          wk3r = w[nw0 + 2 * j + 2];
          wk3i = w[nw0 + 2 * j + 3];
          w[nw1 + j] = wk1r;
          w[nw1 + j + 1] = wk1i;
          w[nw1 + j + 2] = wk3r;
          w[nw1 + j + 3] = wk3i;
        }
      }
      nw0 = nw1;
    }
  }
}